

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

MPP_RET release_task_in_port(MppPort port)

{
  MppTask local_30;
  MppTask mpp_task;
  MppFrame frame;
  MppPacket packet;
  MppPort pvStack_10;
  MPP_RET ret;
  MppPort port_local;
  
  packet._4_4_ = MPP_OK;
  frame = (MppFrame)0x0;
  mpp_task = (MppTask)0x0;
  pvStack_10 = port;
  while( true ) {
    packet._4_4_ = _mpp_port_poll("release_task_in_port",pvStack_10,MPP_POLL_NON_BLOCK);
    if (packet._4_4_ < MPP_OK) {
      return packet._4_4_;
    }
    _mpp_port_dequeue("release_task_in_port",pvStack_10,&local_30);
    if ((local_30 == (MppTask)0x0) &&
       (_mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"mpp_task",
                   "release_task_in_port",0xa2), (mpp_debug & 0x10000000) != 0)) break;
    if (local_30 == (MppTask)0x0) {
      return packet._4_4_;
    }
    frame = (MppFrame)0x0;
    mpp_task = (MppTask)0x0;
    packet._4_4_ = mpp_task_meta_get_frame(local_30,KEY_INPUT_FRAME,&mpp_task);
    if (mpp_task != (MppTask)0x0) {
      mpp_frame_deinit(&mpp_task);
      mpp_task = (MppTask)0x0;
    }
    packet._4_4_ = mpp_task_meta_get_packet(local_30,KEY_OUTPUT_PACKET,&frame);
    if (frame != (MppFrame)0x0) {
      mpp_packet_deinit(&frame);
      frame = (MppFrame)0x0;
    }
    _mpp_port_enqueue("release_task_in_port",pvStack_10,local_30);
    local_30 = (MppTask)0x0;
  }
  abort();
}

Assistant:

static MPP_RET release_task_in_port(MppPort port)
{
    MPP_RET ret = MPP_OK;
    MppPacket packet = NULL;
    MppFrame frame = NULL;
    MppTask mpp_task;

    do {
        ret = mpp_port_poll(port, MPP_POLL_NON_BLOCK);
        if (ret < 0)
            break;

        mpp_port_dequeue(port, &mpp_task);
        mpp_assert(mpp_task);
        if (mpp_task) {
            packet = NULL;
            frame = NULL;
            ret = mpp_task_meta_get_frame(mpp_task, KEY_INPUT_FRAME,  &frame);
            if (frame) {
                mpp_frame_deinit(&frame);
                frame = NULL;
            }
            ret = mpp_task_meta_get_packet(mpp_task, KEY_OUTPUT_PACKET, &packet);
            if (packet) {
                mpp_packet_deinit(&packet);
                packet = NULL;
            }

            mpp_port_enqueue(port, mpp_task);
            mpp_task = NULL;
        } else
            break;
    } while (1);

    return ret;
}